

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

bool ImGui::DragFloatN(char *label,float *v,int components,float v_speed,float v_min,float v_max,
                      char *display_format,float power)

{
  ImGuiWindow *pIVar1;
  ImGuiContext *pIVar2;
  ImGuiContext *pIVar3;
  bool bVar4;
  bool bVar5;
  char *text_end;
  ulong uVar6;
  float w_full;
  float fVar7;
  
  pIVar2 = GImGui;
  pIVar1 = GImGui->CurrentWindow;
  pIVar1->Accessed = true;
  if (pIVar1->SkipItems == false) {
    BeginGroup();
    PushID(label);
    PushMultiItemsWidths(components,w_full);
    if (components < 1) {
      bVar5 = false;
    }
    else {
      uVar6 = 0;
      bVar5 = false;
      do {
        PushID((int)uVar6);
        bVar4 = DragFloat("##v",v,v_speed,v_min,v_max,display_format,power);
        pIVar3 = GImGui;
        fVar7 = (pIVar2->Style).ItemInnerSpacing.x;
        pIVar1 = GImGui->CurrentWindow;
        pIVar1->Accessed = true;
        if (pIVar1->SkipItems == false) {
          if (fVar7 < 0.0) {
            fVar7 = (pIVar3->Style).ItemSpacing.x;
          }
          (pIVar1->DC).CursorPos.x = fVar7 + (pIVar1->DC).CursorPosPrevLine.x;
          (pIVar1->DC).CursorPos.y = (pIVar1->DC).CursorPosPrevLine.y;
          (pIVar1->DC).CurrentLineHeight = (pIVar1->DC).PrevLineHeight;
          (pIVar1->DC).CurrentLineTextBaseOffset = (pIVar1->DC).PrevLineTextBaseOffset;
        }
        bVar5 = (bool)(bVar5 | bVar4);
        PopID();
        PopItemWidth();
        uVar6 = uVar6 + 1;
        v = v + 1;
      } while ((uint)components != uVar6);
    }
    PopID();
    text_end = label;
    if (label != (char *)0xffffffffffffffff) {
      do {
        if (*text_end == '#') {
          if (text_end[1] == '#') goto LAB_00144e76;
        }
        else if (*text_end == '\0') goto LAB_00144e76;
        text_end = text_end + 1;
      } while (text_end != (char *)0xffffffffffffffff);
      text_end = (char *)0xffffffffffffffff;
    }
LAB_00144e76:
    TextUnformatted(label,text_end);
    EndGroup();
  }
  else {
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

bool ImGui::DragFloatN(const char* label, float* v, int components, float v_speed, float v_min, float v_max, const char* display_format, float power)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImGuiContext& g = *GImGui;
    bool value_changed = false;
    BeginGroup();
    PushID(label);
    PushMultiItemsWidths(components);
    for (int i = 0; i < components; i++)
    {
        PushID(i);
        value_changed |= DragFloat("##v", &v[i], v_speed, v_min, v_max, display_format, power);
        SameLine(0, g.Style.ItemInnerSpacing.x);
        PopID();
        PopItemWidth();
    }
    PopID();

    TextUnformatted(label, FindRenderedTextEnd(label));
    EndGroup();

    return value_changed;
}